

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O0

void HTS_Engine_refresh(HTS_Engine *engine)

{
  long in_RDI;
  HTS_SStreamSet *in_stack_00000010;
  
  HTS_GStreamSet_clear((HTS_GStreamSet *)engine);
  HTS_PStreamSet_clear((HTS_PStreamSet *)in_stack_00000010);
  HTS_SStreamSet_clear(in_stack_00000010);
  HTS_Label_clear((HTS_Label *)engine);
  *(undefined1 *)(in_RDI + 0x18) = 0;
  return;
}

Assistant:

void HTS_Engine_refresh(HTS_Engine * engine)
{
   /* free generated parameter stream set */
   HTS_GStreamSet_clear(&engine->gss);
   /* free parameter stream set */
   HTS_PStreamSet_clear(&engine->pss);
   /* free state stream set */
   HTS_SStreamSet_clear(&engine->sss);
   /* free label list */
   HTS_Label_clear(&engine->label);
   /* stop flag */
   engine->condition.stop = FALSE;
}